

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validity_uncompressed.cpp
# Opt level: O2

CompressionFunction * duckdb::ValidityUncompressed::GetFunction(PhysicalType data_type)

{
  CompressionFunction *in_RDI;
  
  in_RDI->type = COMPRESSION_UNCOMPRESSED;
  in_RDI->data_type = data_type;
  in_RDI->init_analyze = ValidityInitAnalyze;
  in_RDI->analyze = ValidityAnalyze;
  in_RDI->final_analyze = ValidityFinalAnalyze;
  in_RDI->init_compression = UncompressedFunctions::InitCompression;
  in_RDI->compress = UncompressedFunctions::Compress;
  in_RDI->compress_finalize = UncompressedFunctions::FinalizeCompress;
  in_RDI->init_prefetch = (compression_init_prefetch_t)0x0;
  in_RDI->init_scan = ValidityInitScan;
  in_RDI->scan_vector = ValidityScan;
  in_RDI->scan_partial = ValidityScanPartial;
  in_RDI->select = (compression_select_t)0x0;
  in_RDI->filter = (compression_filter_t)0x0;
  in_RDI->fetch_row = ValidityFetchRow;
  in_RDI->skip = UncompressedFunctions::EmptySkip;
  in_RDI->init_segment = ValidityInitSegment;
  in_RDI->init_append = ValidityInitAppend;
  in_RDI->append = ValidityAppend;
  in_RDI->finalize_append = ValidityFinalizeAppend;
  in_RDI->revert_append = ValidityRevertAppend;
  in_RDI->cleanup_state = (compression_cleanup_state_t)0x0;
  in_RDI->get_segment_info = (compression_get_segment_info_t)0x0;
  in_RDI->serialize_state = (compression_serialize_state_t)0x0;
  in_RDI->deserialize_state = (compression_deserialize_state_t)0x0;
  in_RDI->validity = REQUIRES_VALIDITY;
  return in_RDI;
}

Assistant:

CompressionFunction ValidityUncompressed::GetFunction(PhysicalType data_type) {
	D_ASSERT(data_type == PhysicalType::BIT);
	return CompressionFunction(CompressionType::COMPRESSION_UNCOMPRESSED, data_type, ValidityInitAnalyze,
	                           ValidityAnalyze, ValidityFinalAnalyze, UncompressedFunctions::InitCompression,
	                           UncompressedFunctions::Compress, UncompressedFunctions::FinalizeCompress,
	                           ValidityInitScan, ValidityScan, ValidityScanPartial, ValidityFetchRow,
	                           UncompressedFunctions::EmptySkip, ValidityInitSegment, ValidityInitAppend,
	                           ValidityAppend, ValidityFinalizeAppend, ValidityRevertAppend);
}